

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cordz_info.cc
# Opt level: O3

void __thiscall absl::lts_20250127::cord_internal::CordzInfo::Untrack(CordzInfo *this)

{
  RefcountAndFlags *pRVar1;
  uint uVar2;
  List *this_00;
  CordzInfo *pCVar3;
  __pointer_type pCVar4;
  __pointer_type pCVar5;
  bool bVar6;
  uint uVar7;
  undefined8 extraout_RAX;
  atomic<absl::lts_20250127::cord_internal::CordzInfo_*> *paVar8;
  
  ODRCheck(this);
  this_00 = this->list_;
  uVar2 = (this_00->mutex).lockword_.super___atomic_base<unsigned_int>._M_i;
  if ((uVar2 & 1) == 0) {
    LOCK();
    uVar7 = (this_00->mutex).lockword_.super___atomic_base<unsigned_int>._M_i;
    if (uVar2 == uVar7) {
      (this_00->mutex).lockword_.super___atomic_base<unsigned_int>._M_i = uVar2 | 1;
      uVar7 = uVar2;
    }
    UNLOCK();
    if ((uVar7 & 1) != 0) goto LAB_01010e51;
  }
  else {
LAB_01010e51:
    base_internal::SpinLock::SlowLock(&this_00->mutex);
  }
  pCVar3 = (this->list_->head)._M_b._M_p;
  pCVar4 = (this->ci_next_)._M_b._M_p;
  pCVar5 = (this->ci_prev_)._M_b._M_p;
  if (pCVar4 == (__pointer_type)0x0) {
LAB_01010db1:
    if (pCVar5 == (__pointer_type)0x0) {
      if (pCVar3 == this) {
        paVar8 = &this->list_->head;
LAB_01010de3:
        (paVar8->_M_b)._M_p = pCVar4;
        LOCK();
        uVar2 = (this_00->mutex).lockword_.super___atomic_base<unsigned_int>._M_i;
        (this_00->mutex).lockword_.super___atomic_base<unsigned_int>._M_i =
             (this_00->mutex).lockword_.super___atomic_base<unsigned_int>._M_i & 2;
        UNLOCK();
        if (7 < uVar2) {
          base_internal::SpinLock::SlowUnlock(&this_00->mutex,uVar2);
        }
        bVar6 = CordzHandle::SafeToDelete(&this->super_CordzHandle);
        if (!bVar6) {
          Mutex::Lock(&this->mutex_);
          if (this->rep_ != (CordRep *)0x0) {
            LOCK();
            pRVar1 = &this->rep_->refcount;
            (pRVar1->count_).super___atomic_base<int>._M_i =
                 (pRVar1->count_).super___atomic_base<int>._M_i + 2;
            UNLOCK();
          }
          Mutex::Unlock(&this->mutex_);
          CordzHandle::Delete(&this->super_CordzHandle);
          return;
        }
        this->rep_ = (CordRep *)0x0;
        (*(this->super_CordzHandle)._vptr_CordzHandle[1])(this);
        return;
      }
      goto LAB_01010e6d;
    }
    if (pCVar3 == this) goto LAB_01010e63;
    if ((pCVar5->ci_next_)._M_b._M_p == this) {
      paVar8 = &pCVar5->ci_next_;
      goto LAB_01010de3;
    }
  }
  else {
    if ((pCVar4->ci_prev_)._M_b._M_p == this) {
      (pCVar4->ci_prev_)._M_b._M_p = pCVar5;
      goto LAB_01010db1;
    }
    Untrack();
LAB_01010e63:
    Untrack();
  }
  Untrack();
LAB_01010e6d:
  Untrack();
  __clang_call_terminate(extraout_RAX);
}

Assistant:

void CordzInfo::Untrack() {
  ODRCheck();
  {
    SpinLockHolder l(&list_->mutex);

    CordzInfo* const head = list_->head.load(std::memory_order_acquire);
    CordzInfo* const next = ci_next_.load(std::memory_order_acquire);
    CordzInfo* const prev = ci_prev_.load(std::memory_order_acquire);

    if (next) {
      ABSL_ASSERT(next->ci_prev_.load(std::memory_order_acquire) == this);
      next->ci_prev_.store(prev, std::memory_order_release);
    }
    if (prev) {
      ABSL_ASSERT(head != this);
      ABSL_ASSERT(prev->ci_next_.load(std::memory_order_acquire) == this);
      prev->ci_next_.store(next, std::memory_order_release);
    } else {
      ABSL_ASSERT(head == this);
      list_->head.store(next, std::memory_order_release);
    }
  }

  // We can no longer be discovered: perform a fast path check if we are not
  // listed on any delete queue, so we can directly delete this instance.
  if (SafeToDelete()) {
    UnsafeSetCordRep(nullptr);
    delete this;
    return;
  }

  // We are likely part of a snapshot, extend the life of the CordRep
  {
    absl::MutexLock lock(&mutex_);
    if (rep_) CordRep::Ref(rep_);
  }
  CordzHandle::Delete(this);
}